

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_fe19af::HandleSubstringCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  int val;
  int val_00;
  cmAlphaNum *this_00;
  string_view value;
  size_t stringLength;
  size_type local_b0;
  cmAlphaNum local_a8;
  undefined1 local_78 [80];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
    val = atoi(pbVar1[2]._M_dataplus._M_p);
    val_00 = atoi(pbVar1[3]._M_dataplus._M_p);
    local_b0 = pbVar1[1]._M_string_length;
    if (val < 0 || (int)local_b0 < val) {
      local_a8.View_._M_len = 0xd;
      local_a8.View_._M_str = "begin index: ";
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_78 + 0x20),val);
      cmStrCat<char[22],unsigned_long>
                ((string *)local_78,&local_a8,(cmAlphaNum *)(local_78 + 0x20),
                 (char (*) [22])" is out of range 0 - ",&local_b0);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (-2 < val_00) {
        this = status->Makefile;
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)(pbVar1 + 1));
        value._M_str = (char *)local_a8.View_._M_len;
        value._M_len = (size_t)local_a8.View_._M_str;
        cmMakefile::AddDefinition(this,pbVar1 + 4,value);
        std::__cxx11::string::~string((string *)&local_a8);
        return true;
      }
      local_a8.View_._M_len = (size_t)&DAT_0000000b;
      local_a8.View_._M_str = "end index: ";
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_78 + 0x20),val_00);
      cmStrCat<char[25]>((string *)local_78,&local_a8,(cmAlphaNum *)(local_78 + 0x20),
                         (char (*) [25])" should be -1 or greater");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    this_00 = (cmAlphaNum *)local_78;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"sub-command SUBSTRING requires four arguments.",
               (allocator<char> *)(local_78 + 0x20));
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_00 = &local_a8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool HandleSubstringCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("sub-command SUBSTRING requires four arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  int begin = atoi(args[2].c_str());
  int end = atoi(args[3].c_str());
  const std::string& variableName = args[4];

  size_t stringLength = stringValue.size();
  int intStringLength = static_cast<int>(stringLength);
  if (begin < 0 || begin > intStringLength) {
    status.SetError(
      cmStrCat("begin index: ", begin, " is out of range 0 - ", stringLength));
    return false;
  }
  if (end < -1) {
    status.SetError(cmStrCat("end index: ", end, " should be -1 or greater"));
    return false;
  }

  status.GetMakefile().AddDefinition(variableName,
                                     stringValue.substr(begin, end));
  return true;
}